

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O3

void __thiscall RealPointIncrement::test_method(RealPointIncrement *this)

{
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_228;
  undefined8 uStack_208;
  double local_200;
  double *local_1f8;
  double *local_1f0;
  Vector3d *local_1e8;
  ulong local_1e0;
  undefined8 *local_1d8;
  double **local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0;
  undefined8 local_1b8;
  shared_count sStack_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined4 local_194;
  Vector3d vx;
  undefined **local_178;
  undefined1 local_170;
  undefined8 *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  Vector3d *local_d8;
  undefined8 local_d0;
  Vector3d vy;
  RealSpace R3;
  void *local_50;
  void *local_40;
  
  mnf::RealSpace::RealSpace(&R3,3);
  local_228.m_row = 0;
  local_228.m_col = 1;
  local_228.m_currentBlockRows = 1;
  vx.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = -7.0;
  local_1e8 = (Vector3d *)0x4000000000000000;
  local_228.m_xpr = &vx;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_228,(Scalar *)&local_1e8);
  local_178 = (undefined **)0x3ff3333333333333;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            (pCVar1,(Scalar *)&local_178);
  if ((local_228.m_currentBlockRows + local_228.m_row == 3) && (local_228.m_col == 1)) {
    local_228.m_row = 0;
    local_228.m_col = 1;
    local_228.m_currentBlockRows = 1;
    vy.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 1.0;
    local_1e8 = (Vector3d *)0x4000000000000000;
    local_228.m_xpr = &vy;
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       (&local_228,(Scalar *)&local_1e8);
    local_178 = (undefined **)0x4008000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              (pCVar1,(Scalar *)&local_178);
    if ((local_228.m_currentBlockRows + local_228.m_row == 3) && (local_228.m_col == 1)) {
      local_d0 = 3;
      local_228.m_currentBlockRows = 0;
      uStack_208 = 0;
      local_228.m_row = 3;
      local_1d0 = (double **)0x0;
      uStack_1c8 = 0;
      local_1e0 = 3;
      local_228.m_xpr = &vx;
      local_1e8 = &vy;
      local_d8 = &vx;
      mnf::Manifold::retractation(&R3,&local_d8,&local_228,&local_1e8);
      free(local_1d0);
      free((void *)local_228.m_currentBlockRows);
      local_e8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
      ;
      local_e0 = "";
      local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x58);
      local_170 = 0;
      local_178 = &PTR__lazy_ostream_0012bb78;
      local_168 = &boost::unit_test::lazy_ostream::inst;
      local_160 = "";
      local_1f0 = &local_200;
      local_200 = 1.48219693752374e-323;
      local_1f8 = (double *)&local_194;
      local_194 = 3;
      local_1c0 = 1;
      local_1b8 = 0;
      sStack_1b0.pi_ = (sp_counted_base *)0x0;
      local_1a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
      ;
      local_1a0 = "";
      local_228.m_currentBlockRows = (Index)&local_1f0;
      local_228.m_row = local_228.m_row & 0xffffffffffffff00;
      local_228.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)&PTR__lazy_ostream_0012bbc8;
      local_228.m_col = (Index)&boost::unit_test::lazy_ostream::inst;
      local_1d0 = &local_1f8;
      local_1e0 = local_1e0 & 0xffffffffffffff00;
      local_1e8 = (Vector3d *)&PTR__lazy_ostream_0012bc08;
      local_1d8 = &boost::unit_test::lazy_ostream::inst;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_1b0);
      local_108 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
      ;
      local_100 = "";
      local_118 = &boost::unit_test::basic_cstring<char_const>::null;
      local_110 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x59);
      local_170 = 0;
      local_178 = &PTR__lazy_ostream_0012bb78;
      local_168 = &boost::unit_test::lazy_ostream::inst;
      local_160 = "";
      local_200._0_4_ = 0xfffffffa;
      local_1c0 = vx.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[0] == -6.0;
      local_1b8 = 0;
      sStack_1b0.pi_ = (sp_counted_base *)0x0;
      local_1a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
      ;
      local_1a0 = "";
      local_1f0 = (double *)&vx;
      local_228.m_row = local_228.m_row & 0xffffffffffffff00;
      local_228.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)&PTR__lazy_ostream_0012bcc8;
      local_228.m_col = (Index)&boost::unit_test::lazy_ostream::inst;
      local_228.m_currentBlockRows = (Index)&local_1f0;
      local_1f8 = &local_200;
      local_1e0 = local_1e0 & 0xffffffffffffff00;
      local_1e8 = (Vector3d *)&PTR__lazy_ostream_0012bc08;
      local_1d8 = &boost::unit_test::lazy_ostream::inst;
      local_1d0 = &local_1f8;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_1b0);
      local_128 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
      ;
      local_120 = "";
      local_138 = &boost::unit_test::basic_cstring<char_const>::null;
      local_130 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x5a);
      local_170 = 0;
      local_178 = &PTR__lazy_ostream_0012bb78;
      local_168 = &boost::unit_test::lazy_ostream::inst;
      local_160 = "";
      local_1f0 = vx.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1;
      local_200 = (double)CONCAT44(local_200._4_4_,4);
      local_1c0 = vx.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1] == 4.0;
      local_1b8 = 0;
      sStack_1b0.pi_ = (sp_counted_base *)0x0;
      local_1a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
      ;
      local_1a0 = "";
      local_228.m_row = local_228.m_row & 0xffffffffffffff00;
      local_228.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)&PTR__lazy_ostream_0012bcc8;
      local_228.m_col = (Index)&boost::unit_test::lazy_ostream::inst;
      local_228.m_currentBlockRows = (Index)&local_1f0;
      local_1f8 = &local_200;
      local_1e0 = local_1e0 & 0xffffffffffffff00;
      local_1e8 = (Vector3d *)&PTR__lazy_ostream_0012bc08;
      local_1d8 = &boost::unit_test::lazy_ostream::inst;
      local_1d0 = &local_1f8;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_1b0);
      local_148 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
      ;
      local_140 = "";
      local_158 = &boost::unit_test::basic_cstring<char_const>::null;
      local_150 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x5b);
      local_170 = 0;
      local_178 = &PTR__lazy_ostream_0012bb78;
      local_168 = &boost::unit_test::lazy_ostream::inst;
      local_160 = "";
      local_1f0 = vx.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2;
      local_200 = 4.2;
      local_1c0 = vx.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2] == 4.2;
      local_1b8 = 0;
      sStack_1b0.pi_ = (sp_counted_base *)0x0;
      local_1a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
      ;
      local_1a0 = "";
      local_228.m_row = local_228.m_row & 0xffffffffffffff00;
      local_228.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)&PTR__lazy_ostream_0012bcc8;
      local_228.m_col = (Index)&boost::unit_test::lazy_ostream::inst;
      local_228.m_currentBlockRows = (Index)&local_1f0;
      local_1f8 = &local_200;
      local_1e0 = local_1e0 & 0xffffffffffffff00;
      local_1e8 = (Vector3d *)&PTR__lazy_ostream_0012bcc8;
      local_1d8 = &boost::unit_test::lazy_ostream::inst;
      local_1d0 = &local_1f8;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_1b0);
      _R3 = std::terminate;
      free(local_40);
      free(local_50);
      mnf::Manifold::~Manifold((Manifold *)&R3);
      return;
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(RealPointIncrement)
{
  RealSpace R3(3);
  Eigen::Vector3d vx;
  Eigen::Vector3d vy;
  vx << -7, 2, 1.2;
  vy << 1, 2, 3;
  R3.retractation(vx, vx, vy);
  BOOST_CHECK_EQUAL(vx.size(), 3);
  BOOST_CHECK_EQUAL(vx[0], -6);
  BOOST_CHECK_EQUAL(vx[1], 4);
  BOOST_CHECK_EQUAL(vx[2], 4.2);
}